

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.h
# Opt level: O0

string * join<std::vector<flow::Instr*,std::allocator<flow::Instr*>>>
                   (string *__return_storage_ptr__,
                   vector<flow::Instr_*,_std::allocator<flow::Instr_*>_> *list,string *separator,
                   offset_in_type_to_subr mapfn)

{
  string *this;
  bool bVar1;
  reference ppIVar2;
  string *psVar3;
  long *plVar4;
  offset_in_type_to_subr in_R8;
  code *local_230;
  Instr **item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<flow::Instr_*,_std::allocator<flow::Instr_*>_> *__range1;
  stringstream local_1c8 [4];
  int i;
  stringstream sstr;
  ostream local_1b8 [376];
  code *local_40;
  offset_in_type_to_subr mapfn_local;
  string *local_30;
  string *separator_local;
  vector<flow::Instr_*,_std::allocator<flow::Instr_*>_> *list_local;
  string *local_10;
  
  local_40 = (code *)mapfn;
  mapfn_local = in_R8;
  local_30 = separator;
  separator_local = (string *)list;
  list_local = (vector<flow::Instr_*,_std::allocator<flow::Instr_*>_> *)mapfn;
  local_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c8);
  this = separator_local;
  __range1._4_4_ = 0;
  __end0 = std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::begin
                     ((vector<flow::Instr_*,_std::allocator<flow::Instr_*>_> *)separator_local);
  item = (Instr **)
         std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::end
                   ((vector<flow::Instr_*,_std::allocator<flow::Instr_*>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<flow::Instr_*const_*,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
                                *)&item);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<flow::Instr_*const_*,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
              ::operator*(&__end0);
    if (__range1._4_4_ != 0) {
      std::operator<<(local_1b8,(string *)local_30);
    }
    plVar4 = (long *)((long)&((*ppIVar2)->super_Value)._vptr_Value + mapfn_local);
    if (((ulong)local_40 & 1) == 0) {
      local_230 = local_40;
    }
    else {
      local_230 = *(code **)(local_40 + *plVar4 + -1);
    }
    psVar3 = (string *)(*local_230)(plVar4);
    std::operator<<(local_1b8,psVar3);
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<flow::Instr_*const_*,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
    ::operator++(&__end0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string join(
    const Container& list,
    const std::string& separator,
    const std::string& (std::remove_pointer<typename Container::value_type>::type::* mapfn)() const) {
  std::stringstream sstr;
  int i = 0;
  for (const auto& item: list) {
    if (i) {
      sstr << separator;
    }
    if constexpr (std::is_pointer<typename Container::value_type>::value) {
      sstr << (item->*mapfn)();
    } else {
      sstr << (item.*mapfn)();
    }
    i++;
  }
  return sstr.str();
}